

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zetMetricTracerDisableExp
          (zet_metric_tracer_exp_handle_t hMetricTracer,ze_bool_t synchronous)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hMetricTracer + 8) + 0x690) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hMetricTracer + 8) + 0x690))
                      (*(undefined8 *)hMetricTracer,synchronous);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricTracerDisableExp(
        zet_metric_tracer_exp_handle_t hMetricTracer,   ///< [in] handle of the metric tracer
        ze_bool_t synchronous                           ///< [in] request synchronous behavior. Confirmation of successful
                                                        ///< asynchronous operation is done by calling ::zetMetricTracerReadDataExp()
                                                        ///< and checking the return status: ::ZE_RESULT_SUCCESS will be returned
                                                        ///< when the tracer is active or when it is inactive but still has data. 
                                                        ///< ::ZE_RESULT_NOT_READY will be returned when the tracer is inactive and
                                                        ///< has no more data to be retrieved.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_tracer_exp_object_t*>( hMetricTracer )->dditable;
        auto pfnDisableExp = dditable->zet.MetricTracerExp.pfnDisableExp;
        if( nullptr == pfnDisableExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricTracer = reinterpret_cast<zet_metric_tracer_exp_object_t*>( hMetricTracer )->handle;

        // forward to device-driver
        result = pfnDisableExp( hMetricTracer, synchronous );

        return result;
    }